

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O3

bool from_issue_266::test_uintwide_t_spot_values_from_issue_266_inc(void)

{
  int *piVar1;
  uint *puVar2;
  int *piVar3;
  uint uVar4;
  array<unsigned_int,_4UL> aVar5;
  bool bVar6;
  long lVar7;
  local_uint128_t inc_value;
  local_uint128_t inc_value_p;
  array<unsigned_int,_4UL> local_38;
  array<unsigned_int,_4UL> local_28;
  value_type_conflict local_18 [6];
  
  local_28.elems[0] = 0;
  local_28.elems[1] = 0;
  local_28.elems[2] = 0;
  local_28.elems[3] = 0;
  bVar6 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::rd_string
                    ((uintwide_t<128U,_unsigned_int,_void,_false> *)&local_28,
                     "0x0000000000000001FFFFFFFFFFFFFFFF",0xffffffffffffffff,0);
  if (!bVar6) {
    local_28.elems[2] = 0xffffffff;
    local_28.elems[0] = 0xffffffff;
    local_28.elems[1] = 0xffffffff;
    local_28.elems[3] = 0xffffffff;
  }
  aVar5.elems = local_28.elems;
  local_38.elems[0] = local_28.elems[0];
  local_38.elems[1] = local_28.elems[1];
  local_38.elems[2] = local_28.elems[2];
  local_38.elems[3] = local_28.elems[3];
  lVar7 = 0;
  local_28.elems = aVar5.elems;
  do {
    piVar1 = (int *)((long)local_38.elems + lVar7);
    *piVar1 = *piVar1 + 1;
    if (*piVar1 != 0) break;
    bVar6 = lVar7 != 0xc;
    lVar7 = lVar7 + 4;
  } while (bVar6);
  local_18[0] = local_38.elems[0];
  local_18[1] = local_38.elems[1];
  local_18[2] = local_38.elems[2];
  local_18[3] = local_38.elems[3];
  lVar7 = 0xc;
  do {
    if (lVar7 == -4) goto LAB_00132d61;
    puVar2 = (uint *)((long)local_18 + lVar7);
    uVar4 = *(uint *)((long)local_28.elems + lVar7);
    lVar7 = lVar7 + -4;
  } while (*puVar2 == uVar4);
  if (uVar4 < *puVar2) {
    local_38.elems[0] = 0;
    local_38.elems[1] = 0;
    local_38.elems[2] = 0;
    local_38.elems[3] = 0;
    bVar6 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::rd_string
                      ((uintwide_t<128U,_unsigned_int,_void,_false> *)&local_38,
                       "0x00000000000000020000000000000000",0xffffffffffffffff,0);
    if (!bVar6) {
      local_38.elems[2] = 0xffffffff;
      local_38.elems[0] = 0xffffffff;
      local_38.elems[1] = 0xffffffff;
      local_38.elems[3] = 0xffffffff;
    }
    lVar7 = 0xc;
    do {
      bVar6 = lVar7 == -4;
      if (bVar6) {
        return bVar6;
      }
      piVar3 = (int *)((long)local_18 + lVar7);
      piVar1 = (int *)((long)local_38.elems + lVar7);
      lVar7 = lVar7 + -4;
    } while (*piVar3 == *piVar1);
  }
  else {
LAB_00132d61:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

auto test_uintwide_t_spot_values_from_issue_266_inc() -> bool
  {
    // See also: https://github.com/ckormanyos/wide-integer/issues/266

    #if defined(WIDE_INTEGER_NAMESPACE)
    using local_uint128_t = WIDE_INTEGER_NAMESPACE::math::wide_integer::uint128_t;
    #else
    using local_uint128_t = ::math::wide_integer::uint128_t;
    #endif

    local_uint128_t inc_value  ("0x0000000000000001FFFFFFFFFFFFFFFF");
    local_uint128_t inc_value_p(++(local_uint128_t(inc_value)));

    const auto result_is_ok = ((inc_value_p > inc_value) && (inc_value_p == local_uint128_t("0x00000000000000020000000000000000")));

    return result_is_ok;
  }